

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<capnp::_::BuilderArena::LocalCapTable>::disposeImpl
          (HeapDisposer<capnp::_::BuilderArena::LocalCapTable> *this,void *pointer)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (pointer != (void *)0x0) {
    lVar1 = *(long *)((long)pointer + 8);
    if (lVar1 != 0) {
      lVar2 = *(long *)((long)pointer + 0x10);
      lVar3 = *(long *)((long)pointer + 0x18);
      *(undefined8 *)((long)pointer + 8) = 0;
      *(undefined8 *)((long)pointer + 0x10) = 0;
      *(undefined8 *)((long)pointer + 0x18) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x20))
                (*(undefined8 **)((long)pointer + 0x20),lVar1,0x10,lVar2 - lVar1 >> 4,
                 lVar3 - lVar1 >> 4,
                 ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::
                 destruct);
    }
    operator_delete(pointer,0x28);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }